

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

SocketPeerInfo * sk_net_peer_info(Socket *sock)

{
  _Bool _Var1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  SocketVtable *pSVar5;
  passwd *ppVar6;
  group *pgVar7;
  passwd **local_1a8;
  char *local_198;
  group *gr;
  passwd *pw;
  char gidbuf [64];
  char uidbuf [64];
  uint local_ec;
  uint local_e8;
  int gid;
  int uid;
  int pid;
  SocketPeerInfo *pi;
  char buf [46];
  undefined1 local_a0 [4];
  socklen_t addrlen;
  sockaddr_union addr;
  NetSocket *s;
  Socket *sock_local;
  
  addr.storage.__ss_align = (unsigned_long)(sock + -0x12);
  stack0xffffffffffffff5c = 0x80;
  s = (NetSocket *)sock;
  iVar3 = getpeername(*(int *)&sock[-0x11].vt,(sockaddr *)local_a0,(socklen_t *)(buf + 0x2c));
  if (iVar3 < 0) {
    sock_local = (Socket *)0x0;
  }
  else {
    _uid = (Socket *)safemalloc(1,0x30,0);
    *(undefined4 *)&_uid->vt = 0;
    _uid[1].vt = (SocketVtable *)0x0;
    *(undefined4 *)&_uid[4].vt = 0xffffffff;
    _uid[5].vt = (SocketVtable *)0x0;
    if (local_a0._0_2_ == 2) {
      *(undefined4 *)&_uid->vt = 1;
      *(socklen_t *)&_uid[2].vt = addrlen;
      uVar2 = ntohs(local_a0._2_2_);
      *(uint *)&_uid[4].vt = (uint)uVar2;
      pcVar4 = inet_ntoa((in_addr)addrlen);
      pSVar5 = (SocketVtable *)dupstr(pcVar4);
      _uid[1].vt = pSVar5;
      pSVar5 = (SocketVtable *)dupprintf("%s:%d",_uid[1].vt,(ulong)*(uint *)&_uid[4].vt);
      _uid[5].vt = pSVar5;
    }
    else if (local_a0._0_2_ == 10) {
      *(undefined4 *)&_uid->vt = 2;
      _uid[2].vt = (SocketVtable *)addr._0_8_;
      _uid[3].vt = (SocketVtable *)addr.sin.sin_zero;
      uVar2 = ntohs(local_a0._2_2_);
      *(uint *)&_uid[4].vt = (uint)uVar2;
      pcVar4 = inet_ntop(10,&addr,(char *)&pi,0x2e);
      pSVar5 = (SocketVtable *)dupstr(pcVar4);
      _uid[1].vt = pSVar5;
      pSVar5 = (SocketVtable *)dupprintf("[%s]:%d",_uid[1].vt,(ulong)*(uint *)&_uid[4].vt);
      _uid[5].vt = pSVar5;
    }
    else {
      if (local_a0._0_2_ != 1) {
        safefree(_uid);
        return (SocketPeerInfo *)0x0;
      }
      *(undefined4 *)&_uid->vt = 3;
      _Var1 = so_peercred(*(int *)(addr.storage.__ss_align + 8),&gid,(int *)&local_e8,
                          (int *)&local_ec);
      if (_Var1) {
        sprintf(gidbuf + 0x38,"%d",(ulong)local_e8);
        sprintf((char *)&pw,"%d",(ulong)local_ec);
        ppVar6 = getpwuid(local_e8);
        pgVar7 = getgrgid(local_ec);
        if (ppVar6 == (passwd *)0x0) {
          local_198 = gidbuf + 0x38;
        }
        else {
          local_198 = ppVar6->pw_name;
        }
        if (pgVar7 == (group *)0x0) {
          local_1a8 = &pw;
        }
        else {
          local_1a8 = (passwd **)pgVar7->gr_name;
        }
        pSVar5 = (SocketVtable *)dupprintf("pid %d (%s:%s)",(ulong)(uint)gid,local_198,local_1a8);
        _uid[5].vt = pSVar5;
      }
    }
    sock_local = _uid;
  }
  return (SocketPeerInfo *)sock_local;
}

Assistant:

static SocketPeerInfo *sk_net_peer_info(Socket *sock)
{
    NetSocket *s = container_of(sock, NetSocket, sock);
    union sockaddr_union addr;
    socklen_t addrlen = sizeof(addr);
#ifndef NO_IPV6
    char buf[INET6_ADDRSTRLEN];
#endif
    SocketPeerInfo *pi;

    if (getpeername(s->s, &addr.sa, &addrlen) < 0)
        return NULL;

    pi = snew(SocketPeerInfo);
    pi->addressfamily = ADDRTYPE_UNSPEC;
    pi->addr_text = NULL;
    pi->port = -1;
    pi->log_text = NULL;

    if (addr.storage.ss_family == AF_INET) {
        pi->addressfamily = ADDRTYPE_IPV4;
        memcpy(pi->addr_bin.ipv4, &addr.sin.sin_addr, 4);
        pi->port = ntohs(addr.sin.sin_port);
        pi->addr_text = dupstr(inet_ntoa(addr.sin.sin_addr));
        pi->log_text = dupprintf("%s:%d", pi->addr_text, pi->port);

#ifndef NO_IPV6
    } else if (addr.storage.ss_family == AF_INET6) {
        pi->addressfamily = ADDRTYPE_IPV6;
        memcpy(pi->addr_bin.ipv6, &addr.sin6.sin6_addr, 16);
        pi->port = ntohs(addr.sin6.sin6_port);
        pi->addr_text = dupstr(
            inet_ntop(AF_INET6, &addr.sin6.sin6_addr, buf, sizeof(buf)));
        pi->log_text = dupprintf("[%s]:%d", pi->addr_text, pi->port);
#endif

    } else if (addr.storage.ss_family == AF_UNIX) {
        pi->addressfamily = ADDRTYPE_LOCAL;

        /*
         * For Unix sockets, the source address is unlikely to be
         * helpful, so we leave addr_txt NULL (and we certainly can't
         * fill in port, obviously). Instead, we try SO_PEERCRED and
         * try to get the source pid, and put that in the log text.
         */
        int pid, uid, gid;
        if (so_peercred(s->s, &pid, &uid, &gid)) {
            char uidbuf[64], gidbuf[64];
            sprintf(uidbuf, "%d", uid);
            sprintf(gidbuf, "%d", gid);
            struct passwd *pw = getpwuid(uid);
            struct group *gr = getgrgid(gid);
            pi->log_text = dupprintf("pid %d (%s:%s)", pid,
                                     pw ? pw->pw_name : uidbuf,
                                     gr ? gr->gr_name : gidbuf);
        }
    } else {
        sfree(pi);
        return NULL;
    }

    return pi;
}